

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

bool __thiscall juzzlin::SimpleLogger::Impl::shouldFlush(Impl *this)

{
  bool bVar1;
  int *in_RDI;
  byte local_32;
  string local_30 [47];
  byte local_1;
  
  local_32 = 0;
  bVar1 = m_level <= *in_RDI;
  if (bVar1) {
    std::__cxx11::ostringstream::str();
    local_32 = std::__cxx11::string::empty();
    local_32 = local_32 ^ 0xff;
  }
  local_1 = local_32 & 1;
  if (bVar1) {
    std::__cxx11::string::~string(local_30);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SimpleLogger::Impl::shouldFlush() const
{
    return m_activeLevel >= m_level && !m_message.str().empty();
}